

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaitaistream.cpp
# Opt level: O0

int16_t __thiscall kaitai::kstream::read_s2be(kstream *this)

{
  __uint16_t _Var1;
  __uint16_t local_12;
  kstream *pkStack_10;
  int16_t t;
  kstream *this_local;
  
  pkStack_10 = this;
  std::istream::read((char *)this->m_io,(long)&local_12);
  _Var1 = __bswap_16(local_12);
  return _Var1;
}

Assistant:

int16_t kaitai::kstream::read_s2be() {
    int16_t t;
    m_io->read(reinterpret_cast<char *>(&t), 2);
#if __BYTE_ORDER == __LITTLE_ENDIAN
    t = bswap_16(t);
#endif
    return t;
}